

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

void __thiscall ON_SubDHeap::Destroy(ON_SubDHeap *this)

{
  Clear(this);
  ON_FixedSizePool::Destroy(&this->m_fspv);
  ON_FixedSizePool::Destroy(&this->m_fspe);
  ON_FixedSizePool::Destroy(&this->m_fspf);
  ON_FixedSizePool::Destroy(&this->m_fsp5);
  ON_FixedSizePool::Destroy(&this->m_fsp9);
  ON_FixedSizePool::Destroy(&this->m_fsp17);
  return;
}

Assistant:

void ON_SubDHeap::Destroy()
{
  Clear();
  m_fspv.Destroy();
  m_fspe.Destroy();
  m_fspf.Destroy();
  m_fsp5.Destroy();
  m_fsp9.Destroy();
  m_fsp17.Destroy();
}